

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

size_t varbuff_to_bytes(uchar *bytes,size_t bytes_len,uchar *bytes_out)

{
  leint16_t tmp;
  long lVar1;
  
  if (bytes_len < 0xfd) {
    *bytes_out = (uchar)bytes_len;
    lVar1 = 1;
    if (bytes_len == 0) goto LAB_00428de0;
  }
  else if (bytes_len < 0x10000) {
    *bytes_out = 0xfd;
    *(short *)(bytes_out + 1) = (short)bytes_len;
    lVar1 = 3;
  }
  else if (bytes_len >> 0x20 == 0) {
    *bytes_out = 0xfe;
    *(int *)(bytes_out + 1) = (int)bytes_len;
    lVar1 = 5;
  }
  else {
    *bytes_out = 0xff;
    *(size_t *)(bytes_out + 1) = bytes_len;
    lVar1 = 9;
  }
  memcpy(bytes_out + lVar1,bytes,bytes_len);
LAB_00428de0:
  return lVar1 + bytes_len;
}

Assistant:

size_t varbuff_to_bytes(const unsigned char *bytes, size_t bytes_len,
                        unsigned char *bytes_out)
{
    size_t n = varint_to_bytes(bytes_len, bytes_out);
    bytes_out += n;
    if (bytes_len)
        memcpy(bytes_out, bytes, bytes_len);
    return n + bytes_len;
}